

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)44>
               (char *string_ptr,idx_t string_size,hugeint_t *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int params_2;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  ExponentData exponent;
  string_t value;
  string local_d8;
  uint local_b8;
  undefined4 local_b4;
  undefined8 uStack_b0;
  DecimalCastData<duckdb::hugeint_t> local_a8;
  CastParameters *local_80;
  hugeint_t *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_78 = result;
  hugeint_t::hugeint_t(&local_a8.result,0);
  uVar9 = (ulong)(uint)((int)CONCAT71(in_register_00000081,width) << 4);
  local_a8.digit_count = '\0';
  local_a8.decimal_count = '\0';
  local_a8.round_set = false;
  local_a8.should_round = false;
  local_a8.excessive_decimals = '\0';
  local_a8.exponent_type = NONE;
  local_a8.limit.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar9);
  local_a8.limit.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar9 + 8);
  local_a8.width = width;
  local_a8.scale = scale;
  local_80 = parameters;
  if (string_size != 0) {
    uVar9 = 0;
    do {
      bVar1 = string_ptr[uVar9];
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        if (bVar1 == 0x2d) {
          uVar5 = string_size - uVar9;
          uVar11 = 1;
          goto LAB_002b51f7;
        }
        if (bVar1 == 0x30 && string_size - 1 != uVar9) {
          bVar2 = string_ptr[uVar9 + 1];
          if (bVar2 < 0x62) {
            if ((bVar2 == 0x42) || (bVar2 == 0x58)) {
LAB_002b54ca:
              if (0xfffffffffffffffd < (string_size - uVar9) - 3) {
                DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                          (&local_a8);
              }
              break;
            }
          }
          else if ((bVar2 == 0x62) || (bVar2 == 0x78)) goto LAB_002b54ca;
        }
        uVar5 = string_size - uVar9;
        uVar12 = (ulong)(bVar1 == 0x2b);
        uVar11 = uVar12;
        goto LAB_002b5505;
      }
      uVar9 = uVar9 + 1;
    } while (string_size != uVar9);
  }
  goto LAB_002b5280;
  while( true ) {
    bVar1 = string_ptr[uVar9 + uVar11] - 0x30;
    if (9 < bVar1) {
      if (string_ptr[uVar9 + uVar11] != ',') goto LAB_002b569a;
      uVar12 = uVar11 + 1;
      iVar6 = 3;
      uVar16 = uVar12;
      if (uVar5 <= uVar12) goto LAB_002b5677;
      goto LAB_002b5437;
    }
    uVar12 = uVar11 + 1;
    bVar3 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_a8,bVar1);
    if (bVar3) {
      bVar17 = true;
      if ((~uVar11 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar11] == '_')) {
        uVar12 = uVar11 + 2;
        if ((string_size - uVar11) - 2 == uVar9) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar9 + uVar12] - 0x30U) < 10;
        }
      }
    }
    else {
      bVar17 = false;
    }
    uVar11 = uVar12;
    bVar3 = false;
    if (!bVar17) break;
LAB_002b51f7:
    if (uVar5 <= uVar11) goto LAB_002b53f5;
  }
  goto LAB_002b5283;
  while( true ) {
    uVar15 = uVar16 + 1;
    if ((~uVar16 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar16] == '_')) {
      lVar8 = string_size - uVar16;
      uVar15 = uVar16 + 2;
      uVar16 = uVar15;
      iVar4 = 1;
      if ((lVar8 - 2U == uVar9) || (9 < (byte)(string_ptr[uVar9 + uVar15] - 0x30U)))
      goto LAB_002b5689;
    }
    uVar16 = uVar15;
    if (uVar5 <= uVar15) break;
LAB_002b5437:
    if (9 < (byte)(string_ptr[uVar9 + uVar16] - 0x30U)) {
      iVar6 = 0;
      goto LAB_002b5677;
    }
    bVar3 = DecimalCastOperation::
            HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>
                      (&local_a8,string_ptr[uVar9 + uVar16] - 0x30U);
    if (!bVar3) {
      iVar4 = 1;
      goto LAB_002b5689;
    }
  }
  iVar6 = 3;
LAB_002b5677:
  iVar4 = 1;
  if (uVar12 < uVar16) {
    iVar4 = iVar6;
  }
  if (1 < uVar11) {
    iVar4 = iVar6;
  }
LAB_002b5689:
  uVar11 = uVar16;
  if (iVar4 != 3) {
    if (iVar4 != 0) goto LAB_002b5280;
LAB_002b569a:
    bVar1 = string_ptr[uVar9 + uVar11];
    bVar3 = false;
    uVar7 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (4 < uVar7 - 9) goto LAB_002b5283;
    }
    else {
      if ((bVar1 == 0x65) || (uVar7 == 0x45)) {
        if ((uVar11 != 1) && (uVar11 + 1 < uVar5)) {
          local_d8._M_dataplus._M_p._0_2_ = 0;
          pcVar14 = string_ptr + uVar9 + uVar11 + 1;
          iVar10 = ~uVar9 + (string_size - uVar11);
          bVar3 = SUB81(uVar11 + 1,0);
          if (*pcVar14 == '-') {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                              (pcVar14,iVar10,(IntegerCastData<short> *)&local_d8,bVar3);
          }
          else {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                              (pcVar14,iVar10,(IntegerCastData<short> *)&local_d8,bVar3);
          }
          if (bVar3 != false) {
            bVar3 = DecimalCastOperation::
                    HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                              (&local_a8,(int)(short)local_d8._M_dataplus._M_p);
            goto LAB_002b5283;
          }
        }
        goto LAB_002b5280;
      }
      if (uVar7 != 0x20) goto LAB_002b5283;
    }
    uVar12 = uVar11 + 1;
    uVar11 = uVar12;
    if (uVar12 < uVar5) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar12] - 9) && (string_ptr[uVar9 + uVar12] != 0x20))
        goto LAB_002b5280;
        uVar12 = uVar12 + 1;
        uVar11 = uVar5;
      } while (uVar5 != uVar12);
    }
  }
LAB_002b53f5:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_a8)
  ;
  if (bVar3) {
    bVar3 = 1 < uVar11;
    goto LAB_002b5283;
  }
  goto LAB_002b5280;
  while( true ) {
    bVar1 = string_ptr[uVar9 + uVar11] - 0x30;
    if (9 < bVar1) {
      if (string_ptr[uVar9 + uVar11] != ',') goto LAB_002b5787;
      uVar16 = uVar11 + 1;
      iVar6 = 3;
      uVar15 = uVar16;
      if (uVar5 <= uVar16) goto LAB_002b5763;
      goto LAB_002b55cd;
    }
    uVar16 = uVar11 + 1;
    bVar3 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                      (&local_a8,bVar1);
    if (bVar3) {
      bVar17 = true;
      if ((~uVar11 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar11] == '_')) {
        uVar16 = uVar11 + 2;
        if ((string_size - uVar11) - 2 == uVar9) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar9 + uVar16] - 0x30U) < 10;
        }
      }
    }
    else {
      bVar17 = false;
    }
    bVar3 = false;
    uVar11 = uVar16;
    if (!bVar17) break;
LAB_002b5505:
    if (uVar5 <= uVar11) goto LAB_002b558a;
  }
  goto LAB_002b5283;
  while( true ) {
    uVar13 = uVar15 + 1;
    if ((~uVar15 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar15] == '_')) {
      lVar8 = string_size - uVar15;
      uVar13 = uVar15 + 2;
      uVar15 = uVar13;
      iVar4 = 1;
      if ((lVar8 - 2U == uVar9) || (9 < (byte)(string_ptr[uVar9 + uVar13] - 0x30U)))
      goto LAB_002b5776;
    }
    uVar15 = uVar13;
    if (uVar5 <= uVar13) break;
LAB_002b55cd:
    if (9 < (byte)(string_ptr[uVar9 + uVar15] - 0x30U)) {
      iVar6 = 0;
      goto LAB_002b5763;
    }
    bVar3 = DecimalCastOperation::
            HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,false,true>
                      (&local_a8,string_ptr[uVar9 + uVar15] - 0x30U);
    if (!bVar3) {
      iVar4 = 1;
      goto LAB_002b5776;
    }
  }
  iVar6 = 3;
LAB_002b5763:
  iVar4 = 1;
  if (uVar16 < uVar15) {
    iVar4 = iVar6;
  }
  if (uVar12 < uVar11) {
    iVar4 = iVar6;
  }
LAB_002b5776:
  uVar11 = uVar15;
  if (iVar4 != 3) {
    if (iVar4 != 0) goto LAB_002b5280;
LAB_002b5787:
    bVar1 = string_ptr[uVar9 + uVar11];
    bVar3 = false;
    uVar7 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (4 < uVar7 - 9) goto LAB_002b5283;
    }
    else {
      if ((bVar1 == 0x65) || (uVar7 == 0x45)) {
        if ((uVar11 != uVar12) && (uVar11 + 1 < uVar5)) {
          local_d8._M_dataplus._M_p._0_2_ = 0;
          pcVar14 = string_ptr + uVar9 + uVar11 + 1;
          iVar10 = ~uVar9 + (string_size - uVar11);
          bVar3 = SUB81(uVar11 + 1,0);
          if (*pcVar14 == '-') {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                              (pcVar14,iVar10,(IntegerCastData<short> *)&local_d8,bVar3);
          }
          else {
            bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                              (pcVar14,iVar10,(IntegerCastData<short> *)&local_d8,bVar3);
          }
          if (bVar3 != false) {
            bVar3 = DecimalCastOperation::
                    HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                              (&local_a8,(int)(short)local_d8._M_dataplus._M_p);
            goto LAB_002b5283;
          }
        }
        goto LAB_002b5280;
      }
      if (uVar7 != 0x20) goto LAB_002b5283;
    }
    uVar16 = uVar11 + 1;
    uVar11 = uVar16;
    if (uVar16 < uVar5) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar16] - 9) && (string_ptr[uVar9 + uVar16] != 0x20))
        goto LAB_002b5280;
        uVar16 = uVar16 + 1;
        uVar11 = uVar5;
      } while (uVar5 != uVar16);
    }
  }
LAB_002b558a:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                    (&local_a8);
  if (bVar3) {
    bVar3 = uVar12 < uVar11;
    goto LAB_002b5283;
  }
LAB_002b5280:
  bVar3 = false;
LAB_002b5283:
  if (bVar3 == false) {
    local_b8 = (uint)string_size;
    if (local_b8 < 0xd) {
      uStack_b0._4_4_ = 0;
      local_b4 = 0;
      uStack_b0._0_4_ = 0;
      uStack_b0 = (char *)0x0;
      if (local_b8 != 0) {
        switchD_00b1422a::default(&local_b4,string_ptr,(ulong)(local_b8 & 0xf));
        uStack_b0 = (char *)CONCAT44(uStack_b0._4_4_,(undefined4)uStack_b0);
      }
    }
    else {
      local_b4 = *(undefined4 *)string_ptr;
      uStack_b0 = string_ptr;
    }
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
    pcVar14 = (char *)&local_b4;
    if (0xc < (ulong)local_b8) {
      pcVar14 = uStack_b0;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar14,pcVar14 + local_b8);
    StringUtil::Format<std::__cxx11::string,int,int>
              (&local_d8,(StringUtil *)local_50,&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,
               (uint)scale,params_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    HandleCastError::AssignError(&local_d8,local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_d8._M_dataplus._M_p._2_6_,(short)local_d8._M_dataplus._M_p) !=
        &local_d8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_d8._M_dataplus._M_p._2_6_,(short)local_d8._M_dataplus._M_p));
    }
  }
  else {
    local_78->lower = local_a8.result.lower;
    local_78->upper = local_a8.result.upper;
  }
  return bVar3;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}